

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O2

IceTImage icetInvokeStrategy(IceTEnum strategy)

{
  int line;
  IceTImage IVar1;
  char *msg;
  
  switch(strategy) {
  case 0x6001:
    IVar1 = icetDirectCompose();
    return (IceTImage)IVar1.opaque_internals;
  case 0x6002:
    IVar1 = icetSequentialCompose();
    return (IceTImage)IVar1.opaque_internals;
  case 0x6003:
    IVar1 = icetSplitCompose();
    return (IceTImage)IVar1.opaque_internals;
  case 0x6004:
    IVar1 = icetReduceCompose();
    return (IceTImage)IVar1.opaque_internals;
  case 0x6005:
    IVar1 = icetVtreeCompose();
    return (IceTImage)IVar1.opaque_internals;
  }
  if (strategy == 0xffffffff) {
    msg = "Strategy not defined. Use icetStrategy to set the strategy.";
    line = 0x76;
  }
  else {
    msg = "Invalid strategy.";
    line = 0x79;
  }
  icetRaiseDiagnostic(msg,0xfffffffe,1,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/strategies/select.c"
                      ,line);
  IVar1 = icetImageNull();
  return (IceTImage)IVar1.opaque_internals;
}

Assistant:

IceTImage icetInvokeStrategy(IceTEnum strategy)
{
    icetRaiseDebug1("Invoking strategy %s",
                    icetStrategyNameFromEnum(strategy));

    switch (strategy) {
      case ICET_STRATEGY_DIRECT:        return icetDirectCompose();
      case ICET_STRATEGY_SEQUENTIAL:    return icetSequentialCompose();
      case ICET_STRATEGY_SPLIT:         return icetSplitCompose();
      case ICET_STRATEGY_REDUCE:        return icetReduceCompose();
      case ICET_STRATEGY_VTREE:         return icetVtreeCompose();
      case ICET_STRATEGY_UNDEFINED:
          icetRaiseError("Strategy not defined. "
                         "Use icetStrategy to set the strategy.",
                         ICET_INVALID_ENUM);
          return icetImageNull();
      default:
          icetRaiseError("Invalid strategy.", ICET_INVALID_ENUM);
          return icetImageNull();
    }
}